

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmLinkInterface * __thiscall
cmGeneratorTarget::GetImportLinkInterface
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *headTarget,
          LinkInterfaceFor interfaceFor,bool secondPass)

{
  _Base_ptr p_Var1;
  cmBTStringRange entries;
  cmBTStringRange entries_00;
  cmBTStringRange entries_01;
  cmGeneratorTarget *this_00;
  ImportInfo *pIVar2;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *this_01;
  cmLinkInterface *this_02;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *this_03;
  pointer n;
  string_view arg;
  string_view arg_00;
  cmGeneratorTarget *headTarget_local;
  cmGeneratorTarget *local_168;
  cmLinkInterface *local_160;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_158;
  LookupLinkItemScope scope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  optional<cmLinkItem> maybeItem;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a8;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  headTarget_local = headTarget;
  local_168 = this;
  pIVar2 = GetImportInfo(this,config);
  if (pIVar2 == (ImportInfo *)0x0) {
    local_160 = (cmLinkInterface *)0x0;
  }
  else {
    if (interfaceFor == Usage) {
      this_01 = &GetHeadToLinkInterfaceUsageRequirementsMap(local_168,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    else {
      this_01 = &GetHeadToLinkInterfaceMap(local_168,config)->
                 super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    if (((this_01->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (p_Var1 = (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       *(char *)&p_Var1[4]._M_parent == '\0')) {
      headTarget_local = *(cmGeneratorTarget **)(p_Var1 + 1);
    }
    this_02 = &std::
               map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
               ::operator[](this_01,&headTarget_local)->super_cmLinkInterface;
    if (secondPass) {
      memset((cmLinkInterface *)&maybeItem,0,0xf8);
      local_a8._M_bucket_count = 1;
      local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a8._M_element_count = 0;
      local_a8._M_rehash_policy._M_max_load_factor = 1.0;
      local_a8._M_rehash_policy._M_next_resize = 0;
      local_a8._M_single_bucket = (__node_base_ptr)0x0;
      local_70._0_8_ = (pointer)0x0;
      local_70._8_4_ = 0;
      local_70._12_4_ = 0;
      local_70._16_4_ = 0;
      local_70._20_8_ = 0;
      local_50._0_8_ = (pointer)0x0;
      local_50._8_6_ = 0;
      local_50._14_2_ = 0;
      local_50._16_6_ = 0;
      local_50._22_8_ = 0;
      local_a8._M_buckets = &local_a8._M_single_bucket;
      cmLinkInterface::operator=(this_02,(cmLinkInterface *)&maybeItem);
      *(undefined4 *)&this_02->field_0xf2 = local_50._26_4_;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_50);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_70);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c0);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_e0);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                 &maybeItem.super__Optional_base<cmLinkItem,_false,_false>._M_payload.
                  super__Optional_payload<cmLinkItem,_true,_false,_false>.
                  super__Optional_payload_base<cmLinkItem>._M_payload._M_value.Backtrace);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                 ((long)&maybeItem.super__Optional_base<cmLinkItem,_false,_false>._M_payload.
                         super__Optional_payload<cmLinkItem,_true,_false,_false>.
                         super__Optional_payload_base<cmLinkItem>._M_payload._M_value.String + 0x18)
                );
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
                ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)&maybeItem);
    }
    local_160 = this_02;
    if (this_02->field_0xf3 == '\0') {
      *(undefined2 *)&this_02->field_0xf2 = 0x101;
      this_02->Multiplicity = pIVar2->Multiplicity;
      arg_00._M_str = (pIVar2->Languages)._M_dataplus._M_p;
      arg_00._M_len = (pIVar2->Languages)._M_string_length;
      cmExpandList(arg_00,&this_02->Languages,false);
      this_00 = local_168;
      entries.Begin._M_current =
           (pIVar2->LibrariesHeadInclude).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      entries.End._M_current =
           (pIVar2->LibrariesHeadInclude).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ExpandLinkItems(local_168,
                      (string *)&(anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_,
                      entries,config,headTarget_local,interfaceFor,HeadInclude,this_02);
      entries_00.Begin._M_current =
           (pIVar2->LibrariesHeadExclude).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      entries_00.End._M_current =
           (pIVar2->LibrariesHeadExclude).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ExpandLinkItems(this_00,(string *)
                              (anonymous_namespace)::
                              kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_,entries_00,config,
                      headTarget_local,interfaceFor,HeadExclude,this_02);
      entries_01.Begin._M_current =
           (pIVar2->Libraries).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      entries_01.End._M_current =
           (pIVar2->Libraries).
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ExpandLinkItems(this_00,&pIVar2->LibrariesProp,entries_01,config,headTarget_local,interfaceFor
                      ,Libraries,this_02);
      arg._M_str = (pIVar2->SharedDeps)._M_dataplus._M_p;
      arg._M_len = (pIVar2->SharedDeps)._M_string_length;
      cmExpandedList_abi_cxx11_(&deps,arg,false);
      scope.LG = this_00->LocalGenerator;
      if (deps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          deps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this_03 = &local_160->SharedDeps;
        n = deps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_158.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_158.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_158);
          LookupLinkItem(&maybeItem,local_168,n,(cmListFileBacktrace *)&local_158,&scope,No);
          if (local_158.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_158.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (maybeItem.super__Optional_base<cmLinkItem,_false,_false>._M_payload.
              super__Optional_payload<cmLinkItem,_true,_false,_false>.
              super__Optional_payload_base<cmLinkItem>._M_engaged == true) {
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      (this_03,(cmLinkItem *)&maybeItem);
          }
          if ((maybeItem.super__Optional_base<cmLinkItem,_false,_false>._M_payload.
               super__Optional_payload<cmLinkItem,_true,_false,_false>.
               super__Optional_payload_base<cmLinkItem>._M_engaged & 1U) != 0) {
            std::_Optional_payload_base<cmLinkItem>::_M_destroy
                      ((_Optional_payload_base<cmLinkItem> *)&maybeItem);
          }
          n = n + 1;
        } while (n != deps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&deps);
    }
  }
  return local_160;
}

Assistant:

const cmLinkInterface* cmGeneratorTarget::GetImportLinkInterface(
  const std::string& config, cmGeneratorTarget const* headTarget,
  LinkInterfaceFor interfaceFor, bool secondPass) const
{
  cmGeneratorTarget::ImportInfo const* info = this->GetImportInfo(config);
  if (!info) {
    return nullptr;
  }

  cmHeadToLinkInterfaceMap& hm =
    (interfaceFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkInterfaceUsageRequirementsMap(config)
       : this->GetHeadToLinkInterfaceMap(config));

  // If the link interface does not depend on the head target
  // then re-use the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    headTarget = hm.begin()->first;
  }

  cmOptionalLinkInterface& iface = hm[headTarget];
  if (secondPass) {
    iface = cmOptionalLinkInterface();
  }
  if (!iface.AllDone) {
    iface.AllDone = true;
    iface.LibrariesDone = true;
    iface.Multiplicity = info->Multiplicity;
    cmExpandList(info->Languages, iface.Languages);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT,
                          cmMakeRange(info->LibrariesHeadInclude), config,
                          headTarget, interfaceFor,
                          LinkInterfaceField::HeadInclude, iface);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
                          cmMakeRange(info->LibrariesHeadExclude), config,
                          headTarget, interfaceFor,
                          LinkInterfaceField::HeadExclude, iface);
    this->ExpandLinkItems(info->LibrariesProp, cmMakeRange(info->Libraries),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::Libraries, iface);
    std::vector<std::string> deps = cmExpandedList(info->SharedDeps);
    LookupLinkItemScope scope{ this->LocalGenerator };
    for (std::string const& dep : deps) {
      if (cm::optional<cmLinkItem> maybeItem = this->LookupLinkItem(
            dep, cmListFileBacktrace(), &scope, LookupSelf::No)) {
        iface.SharedDeps.emplace_back(std::move(*maybeItem));
      }
    }
  }

  return &iface;
}